

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpringConstraint.cpp
# Opt level: O3

int __thiscall
btGeneric6DofSpringConstraint::init(btGeneric6DofSpringConstraint *this,EVP_PKEY_CTX *ctx)

{
  undefined1 auVar1 [16];
  long lVar2;
  undefined1 auVar3 [16];
  long lVar4;
  
  (this->super_btGeneric6DofConstraint).super_btTypedConstraint.super_btTypedObject.m_objectType = 9
  ;
  *(undefined4 *)&(this->super_btGeneric6DofConstraint).field_0x535 = 0;
  *(undefined2 *)&this->field_0x539 = 0;
  this->m_equilibriumPoint[0] = 0.0;
  this->m_equilibriumPoint[1] = 0.0;
  this->m_equilibriumPoint[2] = 0.0;
  this->m_equilibriumPoint[3] = 0.0;
  this->m_equilibriumPoint[4] = 0.0;
  this->m_equilibriumPoint[5] = 0.0;
  this->m_springStiffness[0] = 0.0;
  this->m_springStiffness[1] = 0.0;
  this->m_springStiffness[2] = 0.0;
  this->m_springStiffness[3] = 0.0;
  this->m_springStiffness[4] = 0.0;
  auVar1 = _DAT_001ee270;
  this->m_springStiffness[5] = 0.0;
  lVar2 = 0;
  auVar3 = _DAT_001ee5d0;
  do {
    if (SUB164(auVar3 ^ auVar1,4) == -0x80000000 && SUB164(auVar3 ^ auVar1,0) < -0x7ffffffa) {
      this->m_springDamping[lVar2] = 1.0;
      this->m_springDamping[lVar2 + 1] = 1.0;
    }
    lVar2 = lVar2 + 2;
    lVar4 = auVar3._8_8_;
    auVar3._0_8_ = auVar3._0_8_ + 2;
    auVar3._8_8_ = lVar4 + 2;
  } while (lVar2 != 6);
  return 6;
}

Assistant:

void btGeneric6DofSpringConstraint::init()
{
	m_objectType = D6_SPRING_CONSTRAINT_TYPE;

	for(int i = 0; i < 6; i++)
	{
		m_springEnabled[i] = false;
		m_equilibriumPoint[i] = btScalar(0.f);
		m_springStiffness[i] = btScalar(0.f);
		m_springDamping[i] = btScalar(1.f);
	}
}